

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O2

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::clean_expired_label
          (dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_> *this)

{
  duration local_10;
  
  local_10.__r = std::chrono::_V2::steady_clock::now();
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<137ul>>
  ::
  erase_if<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::clean_expired_label()::_lambda(auto:1&)_1_&>
            ((map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<137ul>>
              *)&this->map_,(anon_class_8_1_ba1d6636 *)&local_10);
  return;
}

Assistant:

void clean_expired_label() override {
    erase_if([now = std::chrono::steady_clock::now()](auto& pair) mutable {
      bool r = std::chrono::duration_cast<std::chrono::seconds>(
                   now - pair.second->get_created_time())
                   .count() >= ylt_label_max_age.count();
      return r;
    });
  }